

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O2

void __thiscall obs::safe_list<obs::slot<void_()>_>::node::node(node *this,slot<void_()> *value)

{
  pthread_t pVar1;
  
  this->value = value;
  this->locks = 0;
  this->next = (node *)0x0;
  pVar1 = pthread_self();
  (this->creator_thread)._M_thread = pVar1;
  this->creator_thread_iterator = (iterator *)0x0;
  return;
}

Assistant:

node(T* value = nullptr)
      : value(value),
        creator_thread(std::this_thread::get_id()) {
    }